

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

bool __thiscall
c4::basic_substring<const_char>::ends_with_any(basic_substring<const_char> *this,ro_substr chars)

{
  char *pcVar1;
  bool bVar2;
  size_t sVar3;
  bool bVar4;
  
  if (this->len == 0) {
    return false;
  }
  sVar3 = 0;
  do {
    bVar4 = chars.len == sVar3;
    bVar2 = !bVar4;
    if (bVar4) {
      return bVar2;
    }
    pcVar1 = chars.str + sVar3;
    sVar3 = sVar3 + 1;
  } while (this->str[this->len - 1] != *pcVar1);
  return bVar2;
}

Assistant:

bool ends_with_any(ro_substr chars) const
    {
        if(len == 0)
        {
            return false;
        }
        for(size_t i = 0; i < chars.len; ++i)
        {
            if(str[len - 1] == chars[i])
            {
                return true;
            }
        }
        return false;
    }